

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Recover(DBImpl *this,VersionEdit *edit,bool *save_manifest)

{
  size_t *rhs;
  long *plVar1;
  value_type vVar2;
  VersionSet *this_00;
  undefined8 uVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  pointer pbVar7;
  size_type sVar8;
  reference filename;
  size_type sVar9;
  reference puVar10;
  Env *pEVar11;
  reference pvVar12;
  VersionEdit *in_RCX;
  undefined1 local_210 [16];
  size_t i_1;
  iterator local_1f8;
  iterator local_1f0;
  Slice local_1c8;
  Slice local_1b8;
  char local_1a8 [8];
  char buf [50];
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  undefined1 auStack_148 [4];
  FileType type;
  uint64_t number;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> expected;
  undefined1 local_108 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  uint64_t prev_log;
  uint64_t min_log;
  SequenceNumber max_sequence;
  Slice local_d0;
  Slice local_c0;
  Slice local_b0;
  Slice local_a0;
  undefined1 local_90 [40];
  undefined4 local_68;
  leveldb local_58 [32];
  Status local_38;
  Status s;
  bool *save_manifest_local;
  VersionEdit *edit_local;
  DBImpl *this_local;
  
  port::Mutex::AssertHeld((Mutex *)&edit[1].log_number_);
  (**(code **)(**(long **)&edit->field_0x8 + 0x48))
            (&s,*(long **)&edit->field_0x8,
             &(edit->new_files_).
              super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  Status::~Status(&s);
  if (*(long *)&edit[1].field_0x18 != 0) {
    __assert_fail("db_lock_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x11e,"Status leveldb::DBImpl::Recover(VersionEdit *, bool *)");
  }
  plVar1 = *(long **)&edit->field_0x8;
  LockFileName(local_58,(string *)
                        &(edit->new_files_).
                         super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  (**(code **)(*plVar1 + 0x68))(&local_38,plVar1,local_58,&edit[1].field_0x18);
  std::__cxx11::string::~string((string *)local_58);
  bVar5 = Status::ok(&local_38);
  if (!bVar5) {
    Status::Status((Status *)this,&local_38);
    local_68 = 1;
    goto LAB_0010b0e7;
  }
  plVar1 = *(long **)&edit->field_0x8;
  CurrentFileName((leveldb *)(local_90 + 8),
                  (string *)
                  &(edit->new_files_).
                   super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  bVar6 = (**(code **)(*plVar1 + 0x30))(plVar1,local_90 + 8);
  std::__cxx11::string::~string((string *)(local_90 + 8));
  if (((bVar6 ^ 0xff) & 1) == 0) {
    if ((edit->last_sequence_ & 0x100) != 0) {
      Slice::Slice(&local_c0,
                   (string *)
                   &(edit->new_files_).
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      Slice::Slice(&local_d0,"exists (error_if_exists is true)");
      Status::InvalidArgument((Status *)this,&local_c0,&local_d0);
      local_68 = 1;
      goto LAB_0010b0e7;
    }
  }
  else {
    if ((edit->last_sequence_ & 1) == 0) {
      Slice::Slice(&local_a0,
                   (string *)
                   &(edit->new_files_).
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      Slice::Slice(&local_b0,"does not exist (create_if_missing is false)");
      Status::InvalidArgument((Status *)this,&local_a0,&local_b0);
      local_68 = 1;
      goto LAB_0010b0e7;
    }
    NewDB((DBImpl *)local_90);
    Status::operator=(&local_38,(Status *)local_90);
    Status::~Status((Status *)local_90);
    bVar5 = Status::ok(&local_38);
    if (!bVar5) {
      Status::Status((Status *)this,&local_38);
      local_68 = 1;
      goto LAB_0010b0e7;
    }
  }
  VersionSet::Recover((VersionSet *)&max_sequence,(bool *)edit[3].next_file_number_);
  Status::operator=(&local_38,(Status *)&max_sequence);
  Status::~Status((Status *)&max_sequence);
  bVar5 = Status::ok(&local_38);
  if (bVar5) {
    pbVar7 = (pointer)VersionSet::LogNumber((VersionSet *)edit[3].next_file_number_);
    filenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)VersionSet::PrevLogNumber((VersionSet *)edit[3].next_file_number_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_108);
    (**(code **)(**(long **)&edit->field_0x8 + 0x38))
              (&expected._M_t._M_impl.super__Rb_tree_header._M_node_count,*(long **)&edit->field_0x8
               ,&(edit->new_files_).
                 super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_108);
    rhs = &expected._M_t._M_impl.super__Rb_tree_header._M_node_count;
    Status::operator=(&local_38,(Status *)rhs);
    Status::~Status((Status *)rhs);
    bVar5 = Status::ok(&local_38);
    if (bVar5) {
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &number);
      VersionSet::AddLiveFiles
                ((VersionSet *)edit[3].next_file_number_,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &number);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
      for (stack0xfffffffffffffe90 = 0; uVar4 = stack0xfffffffffffffe90,
          sVar8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_108), uVar4 < sVar8;
          register0x00000000 = stack0xfffffffffffffe90 + 1) {
        filename = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_108,stack0xfffffffffffffe90);
        bVar5 = ParseFileName(filename,(uint64_t *)auStack_148,
                              (FileType *)
                              ((long)&logs.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        if (((bVar5) &&
            (std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             erase((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &number,(key_type *)auStack_148),
            logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0)) &&
           ((pbVar7 <= (ulong)_auStack_148 ||
            ((pointer)_auStack_148 ==
             filenames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)))) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                     (value_type_conflict *)auStack_148);
        }
      }
      bVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              empty((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &number);
      if (bVar5) {
        local_1f8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
        i_1 = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_1f8._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )i_1);
        for (local_210._8_8_ = (Env *)0x0; uVar3 = local_210._8_8_,
            pEVar11 = (Env *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i)
            , (ulong)uVar3 < pEVar11; local_210._8_8_ = (long)(_func_int ***)local_210._8_8_ + 1) {
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                               local_210._8_8_);
          uVar3 = local_210._8_8_;
          vVar2 = *pvVar12;
          sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
          RecoverLogFile((DBImpl *)local_210,(uint64_t)edit,SUB81(vVar2,0),
                         (bool *)(ulong)((Env *)uVar3 == (Env *)(sVar8 - 1)),in_RCX,
                         (SequenceNumber *)save_manifest);
          Status::operator=(&local_38,(Status *)local_210);
          Status::~Status((Status *)local_210);
          bVar5 = Status::ok(&local_38);
          if (!bVar5) {
            Status::Status((Status *)this,&local_38);
            goto LAB_0010b097;
          }
          this_00 = (VersionSet *)edit[3].next_file_number_;
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                               local_210._8_8_);
          VersionSet::MarkFileNumberUsed(this_00,*pvVar12);
        }
        VersionSet::LastSequence((VersionSet *)edit[3].next_file_number_);
        Status::OK();
      }
      else {
        sVar9 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&number);
        snprintf(local_1a8,0x32,"%d missing files; e.g.",sVar9 & 0xffffffff);
        Slice::Slice(&local_1b8,local_1a8);
        local_1f0 = std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&number);
        puVar10 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&stack0xfffffffffffffe10);
        TableFileName((leveldb *)&stack0xfffffffffffffe18,
                      (string *)
                      &(edit->new_files_).
                       super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,*puVar10);
        Slice::Slice(&local_1c8,(string *)&stack0xfffffffffffffe18);
        Status::Corruption((Status *)this,&local_1b8,&local_1c8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
      }
LAB_0010b097:
      local_68 = 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &number);
    }
    else {
      Status::Status((Status *)this,&local_38);
      local_68 = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
  }
  else {
    Status::Status((Status *)this,&local_38);
    local_68 = 1;
  }
LAB_0010b0e7:
  Status::~Status(&local_38);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Recover(VersionEdit* edit, bool* save_manifest) {
  mutex_.AssertHeld();

  // Ignore error from CreateDir since the creation of the DB is
  // committed only when the descriptor is created, and this directory
  // may already exist from a previous failed creation attempt.
  env_->CreateDir(dbname_);
  assert(db_lock_ == nullptr);
  Status s = env_->LockFile(LockFileName(dbname_), &db_lock_);
  if (!s.ok()) {
    return s;
  }

  if (!env_->FileExists(CurrentFileName(dbname_))) {
    if (options_.create_if_missing) {
      s = NewDB();
      if (!s.ok()) {
        return s;
      }
    } else {
      return Status::InvalidArgument(
          dbname_, "does not exist (create_if_missing is false)");
    }
  } else {
    if (options_.error_if_exists) {
      return Status::InvalidArgument(dbname_,
                                     "exists (error_if_exists is true)");
    }
  }

  s = versions_->Recover(save_manifest);
  if (!s.ok()) {
    return s;
  }
  SequenceNumber max_sequence(0);

  // Recover from all newer log files than the ones named in the
  // descriptor (new log files may have been added by the previous
  // incarnation without registering them in the descriptor).
  //
  // Note that PrevLogNumber() is no longer used, but we pay
  // attention to it in case we are recovering a database
  // produced by an older version of leveldb.
  const uint64_t min_log = versions_->LogNumber();
  const uint64_t prev_log = versions_->PrevLogNumber();
  std::vector<std::string> filenames;
  s = env_->GetChildren(dbname_, &filenames);
  if (!s.ok()) {
    return s;
  }
  std::set<uint64_t> expected;
  versions_->AddLiveFiles(&expected);
  uint64_t number;
  FileType type;
  std::vector<uint64_t> logs;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      expected.erase(number);
      if (type == kLogFile && ((number >= min_log) || (number == prev_log)))
        logs.push_back(number);
    }
  }
  if (!expected.empty()) {
    char buf[50];
    snprintf(buf, sizeof(buf), "%d missing files; e.g.",
             static_cast<int>(expected.size()));
    return Status::Corruption(buf, TableFileName(dbname_, *(expected.begin())));
  }

  // Recover in the order in which the logs were generated
  std::sort(logs.begin(), logs.end());
  for (size_t i = 0; i < logs.size(); i++) {
    s = RecoverLogFile(logs[i], (i == logs.size() - 1), save_manifest, edit,
                       &max_sequence);
    if (!s.ok()) {
      return s;
    }

    // The previous incarnation may not have written any MANIFEST
    // records after allocating this log number.  So we manually
    // update the file number allocation counter in VersionSet.
    versions_->MarkFileNumberUsed(logs[i]);
  }

  if (versions_->LastSequence() < max_sequence) {
    versions_->SetLastSequence(max_sequence);
  }

  return Status::OK();
}